

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

ResolveResult * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::asResolveResult
          (ResolveResult *__return_storage_ptr__,BrandedDecl *this,uint64_t scopeId,
          Builder brandBuilder)

{
  BrandedDecl *pBVar1;
  ErrorReporter *errorReporter;
  Builder target;
  BrandScope *pBVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ElementCount index;
  ulong uVar6;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  Builder scope;
  Builder bindings;
  Builder scopes;
  BrandScope *local_150;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> local_148;
  ulong local_120;
  ulong local_118;
  BrandScope *local_110;
  StructBuilder local_108;
  undefined8 uStack_e0;
  undefined1 local_d8 [48];
  Builder local_a8;
  ListBuilder local_80;
  StructBuilder local_58;
  ulong uVar7;
  
  kj::
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  ::copyFrom(__return_storage_ptr__,&this->body);
  if (__return_storage_ptr__->tag == 1) {
    *(uint64_t *)((long)&__return_storage_ptr__->field_1 + 0x10) = scopeId;
    if ((this->body).tag != 1) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x38f,FAILED,"body.is<Resolver::ResolvedDecl>()","");
      kj::_::Debug::Fault::fatal((Fault *)&local_108);
    }
    pBVar2 = (this->brand).ptr;
    local_148.endPtr = (BrandScope **)0x0;
    local_148.ptr = (BrandScope **)0x0;
    local_148.pos = (BrandScope **)0x0;
    local_110 = pBVar2;
    do {
      local_150 = pBVar2;
      if (((pBVar2->params).size_ != 0) ||
         ((pBVar2->inherited == true && (pBVar2->leafParamCount != 0)))) {
        kj::Vector<capnp::compiler::NodeTranslator::BrandScope*>::
        add<capnp::compiler::NodeTranslator::BrandScope*&>
                  ((Vector<capnp::compiler::NodeTranslator::BrandScope*> *)&local_148,&local_150);
      }
      pBVar2 = (local_150->parent).ptr.ptr;
    } while (pBVar2 != (BrandScope *)0x0);
    if (local_148.pos != local_148.ptr) {
      _::StructBuilder::asReader(&brandBuilder._builder);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_108._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uStack_e0;
      *(void **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_108.data;
      *(WirePointer **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_108.pointers;
      *(SegmentBuilder **)((long)&__return_storage_ptr__->field_1 + 0x30) = local_108.segment;
      *(CapTableBuilder **)((long)&__return_storage_ptr__->field_1 + 0x38) = local_108.capTable;
      (__return_storage_ptr__->field_1).space[0x28] = '\x01';
      local_d8._0_8_ = brandBuilder._builder.segment;
      local_d8._8_8_ = brandBuilder._builder.capTable;
      local_d8._16_8_ = brandBuilder._builder.data;
      local_d8._24_8_ = brandBuilder._builder.pointers;
      local_d8._32_4_ = brandBuilder._builder.dataSize;
      local_d8._36_2_ = brandBuilder._builder.pointerCount;
      local_d8._38_2_ = brandBuilder._builder._38_2_;
      capnp::schema::Brand::Builder::initScopes
                ((Builder *)&local_80,(Builder *)local_d8,
                 (uint)((ulong)((long)local_148.pos - (long)local_148.ptr) >> 3));
      uVar4 = (long)local_148.pos - (long)local_148.ptr >> 3;
      uVar6 = 0;
      local_120 = uVar4;
      while( true ) {
        if (uVar6 == uVar4) break;
        _::ListBuilder::getStructElement(&local_108,&local_80,(ElementCount)uVar6);
        pBVar2 = local_148.ptr[uVar6 & 0xffffffff];
        *(uint64_t *)local_108.data = pBVar2->leafId;
        if (pBVar2->inherited == true) {
          *(undefined2 *)((long)local_108.data + 8) = 1;
          uVar7 = uVar6;
        }
        else {
          local_118 = uVar6;
          capnp::schema::Brand::Scope::Builder::initBind
                    ((Builder *)local_d8,(Builder *)&local_108,(uint)(pBVar2->params).size_);
          uVar3 = local_d8._24_8_ & 0xffffffff;
          index = 0;
          for (lVar5 = 0; uVar4 = local_120, uVar7 = local_118, uVar3 * 0xa8 - lVar5 != 0;
              lVar5 = lVar5 + 0xa8) {
            pBVar1 = (local_148.ptr[uVar6 & 0xffffffff]->params).ptr;
            errorReporter = local_110->errorReporter;
            _::ListBuilder::getStructElement(&local_58,(ListBuilder *)local_d8,index);
            capnp::schema::Brand::Binding::Builder::initType(&local_a8,(Builder *)&local_58);
            target._builder.capTable = local_a8._builder.capTable;
            target._builder.segment = local_a8._builder.segment;
            target._builder.data = local_a8._builder.data;
            target._builder.pointers = local_a8._builder.pointers;
            target._builder.dataSize = local_a8._builder.dataSize;
            target._builder.pointerCount = local_a8._builder.pointerCount;
            target._builder._38_2_ = local_a8._builder._38_2_;
            compileAsType((BrandedDecl *)((long)&(pBVar1->body).tag + lVar5),errorReporter,target);
            index = index + 1;
          }
        }
        uVar6 = uVar7 + 1;
      }
    }
    kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::dispose(&local_148);
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::Resolver::ResolveResult NodeTranslator::BrandedDecl::asResolveResult(
    uint64_t scopeId, schema::Brand::Builder brandBuilder) {
  auto result = body;
  if (result.is<Resolver::ResolvedDecl>()) {
    // May need to compile our context as the "brand".

    result.get<Resolver::ResolvedDecl>().scopeId = scopeId;

    getIdAndFillBrand([&]() {
      result.get<Resolver::ResolvedDecl>().brand = brandBuilder.asReader();
      return brandBuilder;
    });
  }
  return result;
}